

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O3

void __thiscall wasm::Vacuum::visitTryTable(Vacuum *this,TryTable *curr)

{
  Expression *expression;
  Expression **ppEVar1;
  EffectAnalyzer local_188;
  
  EffectAnalyzer::EffectAnalyzer
            (&local_188,
             &((this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,curr->body);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_188.delegateTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_188.breakTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_188.globalsWritten._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_188.mutableGlobalsRead._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_188.localsWritten._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_188.localsRead._M_t);
  if ((local_188.throws_ == false) &&
     (local_188.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    expression = curr->body;
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               expression);
    ppEVar1 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                          .expressionStack);
    *ppEVar1 = expression;
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    // If try_table's body does not throw, the whole try_table can be replaced
    // with the try_table's body.
    if (!EffectAnalyzer(getPassOptions(), *getModule(), curr->body).throws()) {
      replaceCurrent(curr->body);
      return;
    }
  }